

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

bool __thiscall cmCTestP4::UserParser::ProcessLine(UserParser *this)

{
  RegularExpression *this_00;
  cmCTestP4 *pcVar1;
  bool bVar2;
  mapped_type *this_01;
  string local_c0;
  User NewUser;
  
  this_00 = &this->RegexUser;
  bVar2 = cmsys::RegularExpression::find(this_00,&(this->super_LineParser).Line);
  if (bVar2) {
    NewUser.UserName._M_dataplus._M_p = (pointer)&NewUser.UserName.field_2;
    NewUser.UserName._M_string_length = 0;
    NewUser.UserName.field_2._M_local_buf[0] = '\0';
    NewUser.Name._M_dataplus._M_p = (pointer)&NewUser.Name.field_2;
    NewUser.Name._M_string_length = 0;
    NewUser.Name.field_2._M_local_buf[0] = '\0';
    NewUser.EMail._M_dataplus._M_p = (pointer)&NewUser.EMail.field_2;
    NewUser.EMail._M_string_length = 0;
    NewUser.EMail.field_2._M_local_buf[0] = '\0';
    NewUser.AccessTime._M_dataplus._M_p = (pointer)&NewUser.AccessTime.field_2;
    NewUser.AccessTime._M_string_length = 0;
    NewUser.AccessTime.field_2._M_local_buf[0] = '\0';
    cmsys::RegularExpression::match_abi_cxx11_(&local_c0,this_00,1);
    std::__cxx11::string::operator=((string *)&NewUser,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    cmsys::RegularExpression::match_abi_cxx11_(&local_c0,this_00,2);
    std::__cxx11::string::operator=((string *)&NewUser.EMail,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    cmsys::RegularExpression::match_abi_cxx11_(&local_c0,this_00,3);
    std::__cxx11::string::operator=((string *)&NewUser.Name,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    cmsys::RegularExpression::match_abi_cxx11_(&local_c0,this_00,4);
    std::__cxx11::string::operator=((string *)&NewUser.AccessTime,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    pcVar1 = this->P4;
    cmsys::RegularExpression::match_abi_cxx11_(&local_c0,this_00,1);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
              ::operator[](&pcVar1->Users,&local_c0);
    User::operator=(this_01,&NewUser);
    std::__cxx11::string::~string((string *)&local_c0);
    User::~User(&NewUser);
  }
  return !bVar2;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexUser.find(this->Line))
      {
      User NewUser;

      NewUser.UserName = this->RegexUser.match(1);
      NewUser.EMail = this->RegexUser.match(2);
      NewUser.Name = this->RegexUser.match(3);
      NewUser.AccessTime = this->RegexUser.match(4);
      P4->Users[this->RegexUser.match(1)] = NewUser;

      return false;
      }
    return true;
    }